

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

int sf::Shader::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int extraout_EAX;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  GLhandleARB *pGVar3;
  TransientContextLock lock;
  ostream *in_stack_ffffffffffffffc0;
  TransientContextLock *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pGVar3 = (GLhandleARB *)CONCAT44(in_register_0000003c,__fd);
  GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffffd0);
  bVar1 = isAvailable();
  if (bVar1) {
    if ((pGVar3 == (GLhandleARB *)0x0) || (*pGVar3 == 0)) {
      (*sf_glad_glUseProgramObjectARB)(0);
    }
    else {
      (*sf_glad_glUseProgramObjectARB)(*pGVar3);
      bindTextures((Shader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (pGVar3[1] != 0xffffffff) {
        (*sf_glad_glUniform1iARB)(pGVar3[1],0);
      }
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Failed to bind or unbind shader: your system doesn\'t support shaders "
                            );
    in_stack_ffffffffffffffc0 =
         std::operator<<(poVar2,
                         "(you should test Shader::isAvailable() before trying to use the Shader class)"
                        );
    std::ostream::operator<<(in_stack_ffffffffffffffc0,std::endl<char,std::char_traits<char>>);
  }
  GlResource::TransientContextLock::~TransientContextLock
            ((TransientContextLock *)in_stack_ffffffffffffffc0);
  return extraout_EAX;
}

Assistant:

void Shader::bind(const Shader* shader)
{
    TransientContextLock lock;

    // Make sure that we can use shaders
    if (!isAvailable())
    {
        err() << "Failed to bind or unbind shader: your system doesn't support shaders "
              << "(you should test Shader::isAvailable() before trying to use the Shader class)" << std::endl;
        return;
    }

    if (shader && shader->m_shaderProgram)
    {
        // Enable the program
        glCheck(GLEXT_glUseProgramObject(castToGlHandle(shader->m_shaderProgram)));

        // Bind the textures
        shader->bindTextures();

        // Bind the current texture
        if (shader->m_currentTexture != -1)
            glCheck(GLEXT_glUniform1i(shader->m_currentTexture, 0));
    }
    else
    {
        // Bind no shader
        glCheck(GLEXT_glUseProgramObject(0));
    }
}